

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

int canvas_undo_arrange(_glist *x,void *z,int action)

{
  _gobj *p_Var1;
  int iVar2;
  t_gobj *ptVar3;
  t_gobj *ptVar4;
  int local_5c;
  _gobj *p_Stack_58;
  int arrangeaction;
  t_gobj *oldy_next;
  t_gobj *oldy_prev;
  t_gobj *next;
  t_gobj *prev;
  t_gobj *y;
  t_undo_arrange *buf;
  int action_local;
  void *z_local;
  _glist *x_local;
  
  if ((*(ushort *)&x->field_0xe8 >> 5 & 1) == 0) {
    canvas_editmode(x,1.0);
  }
  if (action == 0) {
    freebytes(z,8);
  }
  else if (action == 1) {
    if (*(int *)((long)z + 4) != *z) {
      ptVar4 = glist_nth(x,*(int *)((long)z + 4));
      glist_noselect(x);
      glist_select(x,ptVar4);
      if (*(int *)((long)z + 4) == 0) {
        ptVar3 = glist_nth(x,*z);
        p_Var1 = ptVar3->g_next;
        x->gl_list = ptVar4->g_next;
        ptVar3->g_next = ptVar4;
        ptVar4->g_next = p_Var1;
      }
      else {
        ptVar3 = glist_nth(x,*(int *)((long)z + 4) + -1);
        ptVar3->g_next = (_gobj *)0x0;
        if (*z == 0) {
          ptVar4->g_next = x->gl_list;
          x->gl_list = ptVar4;
        }
        else {
          ptVar3 = glist_nth(x,*z + -1);
          p_Var1 = ptVar3->g_next;
          ptVar3->g_next = ptVar4;
          ptVar4->g_next = p_Var1;
        }
      }
      if ((*(ushort *)&x->field_0xe8 & 1) != 0) {
        canvas_redraw(x);
      }
    }
  }
  else if (action == 2) {
    oldy_next = (t_gobj *)0x0;
    p_Stack_58 = (t_gobj *)0x0;
    if (*(int *)((long)z + 4) != *z) {
      ptVar4 = glist_nth(x,*z);
      glist_noselect(x);
      glist_select(x,ptVar4);
      if (*(int *)((long)z + 4) == 0) {
        local_5c = 4;
      }
      else {
        local_5c = 3;
      }
      iVar2 = glist_getindex(x,ptVar4);
      if (iVar2 != 0) {
        oldy_next = glist_nth(x,*z + -1);
      }
      if (ptVar4->g_next != (_gobj *)0x0) {
        p_Stack_58 = ptVar4->g_next;
      }
      canvas_doarrange(x,(float)local_5c,ptVar4,oldy_next,p_Stack_58);
    }
  }
  return 1;
}

Assistant:

int canvas_undo_arrange(t_canvas *x, void *z, int action)
{
    t_undo_arrange *buf = z;
    t_gobj *y=NULL, *prev=NULL, *next=NULL;

    if (!x->gl_edit)
        canvas_editmode(x, 1);

    switch(action)
    {

    case UNDO_UNDO:
        if(buf->u_newindex == buf->u_previndex) return 1;
            /* this is our object */
        y = glist_nth(x, buf->u_newindex);

            /* select object */
        glist_noselect(x);
        glist_select(x, y);

        if (buf->u_newindex)
        {
                /* if it is the last object */

                /* first previous object should point to nothing */
            prev = glist_nth(x, buf->u_newindex - 1);
            prev->g_next = NULL;

                /* now we reuse vars for the following:
                   old index should be right before the object previndex
                   is pointing to as the object was moved to the end */

                /* old position is not first */
            if (buf->u_previndex)
            {
                prev = glist_nth(x, buf->u_previndex - 1);
                next = prev->g_next;

                    /* now readjust pointers */
                prev->g_next = y;
                y->g_next = next;
            }
                /* old position is first */
            else {
                prev = NULL;
                next = x->gl_list;

                    /* now readjust pointers */
                y->g_next = next;
                x->gl_list = y;
            }
        }
        else {
                /* if it is the first object */

                /* old index should be right after the object previndex
                   is pointing to as the object was moved to the end */
            prev = glist_nth(x, buf->u_previndex);

                /* next may be NULL and that is ok */
            next = prev->g_next;

                /* first glist pointer needs to point to the second object */
            x->gl_list = y->g_next;

                /* now readjust pointers */
            prev->g_next = y;
            y->g_next = next;
        }
            /* and finally redraw canvas */
        if (x->gl_havewindow)
            canvas_redraw(x);
        break;
    case UNDO_REDO:
    {
        t_gobj *oldy_prev=NULL, *oldy_next=NULL;
        int arrangeaction;

        if(buf->u_newindex == buf->u_previndex) return 1;
            /* find our object */
        y = glist_nth(x, buf->u_previndex);

            /* select object */
        glist_noselect(x);
        glist_select(x, y);

        if (!buf->u_newindex) arrangeaction = 4;
        else arrangeaction = 3;


            /* if there is an object before ours (in other words our index is > 0) */
        if (glist_getindex(x,y))
            oldy_prev = glist_nth(x, buf->u_previndex - 1);

            /* if there is an object after ours */
        if (y->g_next)
            oldy_next = y->g_next;

        canvas_doarrange(x, arrangeaction, y, oldy_prev, oldy_next);
    }
        break;
    case UNDO_FREE:
        t_freebytes(buf, sizeof(*buf));
    }
    return 1;
}